

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_SetUnlockingScript_Test::TestBody
          (AbstractTransaction_SetUnlockingScript_Test *this)

{
  bool bVar1;
  char *message;
  allocator local_15a;
  allocator local_159;
  Script local_158;
  string local_120;
  AssertionResult gtest_ar;
  AbstractTxInReference local_e0;
  Transaction tx;
  
  cfd::core::Transaction::Transaction(&tx,2,3);
  std::__cxx11::string::string
            ((string *)&local_120,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"
             ,&local_159);
  cfd::core::Txid::Txid((Txid *)&local_158,&local_120);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac",&local_15a);
  cfd::core::Script::Script((Script *)&local_e0,(string *)&gtest_ar);
  cfd::core::Transaction::AddTxIn(&tx,(Txid *)&local_158,0,0xffffffff,(Script *)&local_e0);
  cfd::core::Script::~Script((Script *)&local_e0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&local_158);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Script::Script((Script *)&local_e0);
    cfd::core::Transaction::SetUnlockingScript(&tx,3,(Script *)&local_e0);
    cfd::core::Script::~Script((Script *)&local_e0);
  }
  testing::Message::Message((Message *)&local_e0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_158,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0x95,
             "Expected: tx.SetUnlockingScript(3, Script()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_e0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_e0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_158,"61",(allocator *)&local_120);
    cfd::core::Script::Script((Script *)&local_e0,(string *)&local_158);
    cfd::core::Transaction::SetUnlockingScript(&tx,0,(Script *)&local_e0);
    cfd::core::Script::~Script((Script *)&local_e0);
    std::__cxx11::string::~string((string *)&local_158);
  }
  testing::Message::Message((Message *)&local_e0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_158,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0x96,
             "Expected: tx.SetUnlockingScript(0, Script(\"61\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_e0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_e0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_158,
                 "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"
                 ,(allocator *)&local_120);
      cfd::core::Script::Script((Script *)&local_e0,(string *)&local_158);
      cfd::core::Transaction::SetUnlockingScript(&tx,0,(Script *)&local_e0);
      cfd::core::Script::~Script((Script *)&local_e0);
      std::__cxx11::string::~string((string *)&local_158);
    }
  }
  else {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x9c,
               "Expected: tx.SetUnlockingScript( 0, Script( \"47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_e0,&tx,0);
  cfd::core::Script::Script(&local_158,&local_e0.unlocking_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_120,&local_158);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str()",
             "\"47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\""
             ,local_120._M_dataplus._M_p,
             "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"
            );
  std::__cxx11::string::~string((string *)&local_120);
  cfd::core::Script::~Script(&local_158);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Transaction::~Transaction(&tx);
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, Script()), CfdException);
  EXPECT_THROW(tx.SetUnlockingScript(0, Script("61")), CfdException);

  EXPECT_NO_THROW(
      tx.SetUnlockingScript(
          0,
          Script(
              "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763")));

  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}